

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,RuleCharacterIterator *chars,SymbolTable *symbols,
          UnicodeString *rebuiltPat,uint32_t options,offset_in_UnicodeSet_to_subr caseClosure,
          int32_t depth,UErrorCode *ec)

{
  ushort uVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  UChar32 UVar6;
  BMPSet *pBVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UnicodeString *pUVar9;
  UnicodeString *extraout_RAX;
  undefined7 uVar11;
  UnicodeSet *pUVar10;
  UObject UVar12;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t extraout_RDX_02;
  __off_t extraout_RDX_03;
  __off_t extraout_RDX_04;
  __off_t extraout_RDX_05;
  __off_t __length;
  char cVar13;
  UChar *result;
  undefined8 uVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  undefined4 in_stack_0000000c;
  UBool literal;
  UnicodeString *in_stack_00000018;
  UnicodeSetPointer scratch;
  UnicodeString patLocal;
  Pos backup;
  UnicodeString buf;
  UBool local_14d;
  uint local_14c;
  uint local_148;
  uint local_144;
  UnicodeSet *local_140;
  uint local_134;
  undefined8 local_130;
  undefined1 local_128 [20];
  uint local_114;
  BMPSet *local_110;
  BMPSet *local_108;
  _func_int **local_100;
  UObject local_f8;
  uint local_ec;
  undefined1 local_e8 [64];
  undefined1 local_a8 [32];
  BMPSet *local_88;
  UChar *local_80;
  UnicodeString local_70;
  BMPSet *this_00;
  
  if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject) {
    return;
  }
  if (100 < (int)caseClosure) {
    *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = 1;
    return;
  }
  local_f8._vptr_UObject = (_func_int **)CONCAT44(in_stack_0000000c,depth);
  local_100 = (_func_int **)ec;
  local_e8._0_8_ = &PTR__UnicodeString_003b5258;
  local_e8._8_2_ = 2;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_110 = (BMPSet *)0x0;
  result = (UChar *)chars;
  local_140 = this;
  local_114 = options;
  clear(this);
  local_134 = (local_114 & 1) * 4 + 3;
  local_ec = (int)caseClosure + 1;
  local_a8._24_8_ = &PTR__UnicodeSet_003b50a0;
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_14c = 0;
  local_148 = 0;
  local_130 = 0;
  local_144 = 0;
  local_108 = (BMPSet *)0x0;
  local_88 = (BMPSet *)rebuiltPat;
  do {
    UVar2 = RuleCharacterIterator::atEnd(chars);
    if (UVar2 != '\0') break;
    local_14d = '\0';
    result = (UChar *)(ulong)local_134;
    UVar2 = resemblesPropertyPattern(chars,local_134);
    if (UVar2 == '\0') {
      RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
      result = (UChar *)(ulong)local_134;
      uVar4 = RuleCharacterIterator::next
                        (chars,local_134,&local_14d,(UErrorCode *)in_stack_00000018);
      pBVar7 = (BMPSet *)(ulong)uVar4;
      iVar15 = 1;
      if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
      goto LAB_002bf5df;
      if ((uVar4 == 0x5b) && (local_14d == '\0')) {
        if ((char)local_130 == '\x01') {
          result = (UChar *)local_a8;
          RuleCharacterIterator::setPos(chars,(Pos *)result);
          cVar13 = '\x01';
          pBVar7 = (BMPSet *)0x5b;
          __length = extraout_RDX_01;
          goto LAB_002bec64;
        }
        local_128._0_2_ = 0x5b;
        UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
        RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
        result = (UChar *)(ulong)local_134;
        pUVar9 = in_stack_00000018;
        UVar6 = RuleCharacterIterator::next
                          (chars,local_134,&local_14d,(UErrorCode *)in_stack_00000018);
        uVar14 = CONCAT44(extraout_var_00,UVar6);
        local_130 = CONCAT71((int7)((ulong)pUVar9 >> 8),1);
        if (*(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject < 1) {
          __length = extraout_RDX_03;
          if ((UVar6 == 0x5e) && (local_14d == '\0')) {
            local_128._0_2_ = 0x5e;
            UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
            RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
            result = (UChar *)(ulong)local_134;
            pUVar9 = in_stack_00000018;
            UVar6 = RuleCharacterIterator::next
                              (chars,local_134,&local_14d,(UErrorCode *)in_stack_00000018);
            uVar14 = CONCAT44(extraout_var_01,UVar6);
            local_a8._17_7_ = (undefined7)((ulong)pUVar9 >> 8);
            local_a8[0x10] = '\x01';
            __length = extraout_RDX_04;
            if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject) {
              local_130 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
              iVar15 = 1;
              goto LAB_002bf5df;
            }
          }
          if ((int)uVar14 == 0x2d) {
            local_14d = '\x01';
            pBVar7 = (BMPSet *)0x2d;
            local_130 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
            goto LAB_002bf28f;
          }
          result = (UChar *)local_a8;
          RuleCharacterIterator::setPos(chars,(Pos *)result);
          iVar15 = 2;
        }
      }
      else {
        __length = extraout_RDX_00;
        if (symbols == (SymbolTable *)0x0) {
LAB_002bf28f:
          this_00 = (BMPSet *)0x0;
          cVar13 = '\0';
          goto LAB_002bec67;
        }
        result = (UChar *)(ulong)uVar4;
        iVar3 = (*symbols->_vptr_SymbolTable[3])(symbols);
        this_00 = (BMPSet *)CONCAT44(extraout_var,iVar3);
        if (this_00 == (BMPSet *)0x0) {
          bVar16 = true;
LAB_002bf0bd:
          this_00 = (BMPSet *)0x0;
          cVar13 = '\0';
        }
        else {
          bVar16 = (((UnicodeFilter *)&this_00->_vptr_BMPSet)->super_UnicodeFunctor).super_UObject.
                   _vptr_UObject == (_func_int **)local_a8._24_8_;
          if (!bVar16) {
            *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject =
                 0x10002;
            goto LAB_002bf0bd;
          }
          cVar13 = '\x03';
        }
        __length = extraout_RDX_02;
        if (bVar16) goto LAB_002bec67;
      }
      goto LAB_002bf5df;
    }
    cVar13 = '\x02';
    pBVar7 = (BMPSet *)0x0;
    __length = extraout_RDX;
LAB_002bec64:
    this_00 = (BMPSet *)0x0;
LAB_002bec67:
    if (cVar13 == '\0') {
      if ((char)local_130 == '\0') {
LAB_002bf5cb:
        *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = 0x10002
        ;
LAB_002bf5d9:
        iVar15 = 1;
      }
      else if (local_14d == '\0') {
        iVar15 = (int)pBVar7;
        result = (UChar *)(ulong)local_148;
        uVar8 = (ulong)local_144;
        if (0x5c < iVar15) {
          if (iVar15 == 0x7b) {
            if ((short)local_14c == 0) {
              if ((char)local_144 == '\x01') {
                add(local_140,local_148,local_148);
                _appendToPat((UnicodeString *)local_e8,local_148,'\0');
                __length = extraout_RDX_05;
              }
              result = (UChar *)0x0;
              UnicodeString::truncate(&local_70,(char *)0x0,__length);
              while (UVar2 = RuleCharacterIterator::atEnd(chars), UVar2 == '\0') {
                result = (UChar *)(ulong)local_134;
                uVar4 = RuleCharacterIterator::next
                                  (chars,local_134,&local_14d,(UErrorCode *)in_stack_00000018);
                if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
                goto LAB_002bf547;
                if ((uVar4 == 0x7d) && (local_14d == '\0')) break;
                result = (UChar *)(ulong)uVar4;
                UnicodeString::append(&local_70,uVar4);
              }
              uVar5 = local_70.fUnion.fFields.fLength;
              if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
                uVar5 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if ((UVar2 == '\0') && (0 < (int)uVar5)) {
                add(local_140,&local_70);
                local_128._0_2_ = L'{';
                UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
                _appendToPat((UnicodeString *)local_e8,&local_70,'\0');
                local_128._0_2_ = 0x7d;
                result = (UChar *)local_128;
                UnicodeString::doAppend((UnicodeString *)local_e8,result,0,1);
                iVar15 = 2;
              }
              else {
                *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject =
                     0x10002;
LAB_002bf547:
                iVar15 = 1;
              }
              local_144 = 0;
              goto LAB_002bf5df;
            }
          }
          else if (iVar15 != 0x5e) {
            if (iVar15 != 0x5d) goto LAB_002bedbe;
            if ((char)local_144 == '\x01') {
              add(local_140,local_148,local_148);
              result = (UChar *)(ulong)local_148;
              _appendToPat((UnicodeString *)local_e8,local_148,'\0');
            }
            if ((short)local_14c != 0x26) {
              if ((local_14c & 0xffff) == 0x2d) {
                add(local_140,0x2d,0x2d);
                local_128._0_2_ = (short)local_14c;
                UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
              }
              local_128._0_2_ = 0x5d;
              result = (UChar *)local_128;
              pUVar9 = UnicodeString::doAppend((UnicodeString *)local_e8,result,0,1);
LAB_002bf01f:
              local_130 = CONCAT71((int7)((ulong)pUVar9 >> 8),2);
              iVar15 = 2;
              goto LAB_002bf5df;
            }
          }
          goto LAB_002bf5cb;
        }
        if (iVar15 == 0x24) {
          RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
          result = (UChar *)(ulong)local_134;
          uVar4 = RuleCharacterIterator::next
                            (chars,local_134,&local_14d,(UErrorCode *)in_stack_00000018);
          pBVar7 = (BMPSet *)(ulong)uVar4;
          iVar15 = 1;
          if (*(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject < 1) {
            bVar16 = uVar4 != 0x5d;
            bVar17 = local_14d != '\0';
            if (symbols == (SymbolTable *)0x0 && (bVar17 || bVar16)) {
              RuleCharacterIterator::setPos(chars,(Pos *)local_a8);
              iVar15 = 6;
              pBVar7 = (BMPSet *)0x24;
            }
            else if ((bVar17 || bVar16) || (short)local_14c != 0) {
              *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject =
                   0x10002;
            }
            else {
              if ((char)local_144 == '\x01') {
                add(local_140,local_148,local_148);
                _appendToPat((UnicodeString *)local_e8,local_148,'\0');
              }
              add(local_140,0xffff);
              local_128._0_2_ = L'$';
              UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
              local_128._0_2_ = 0x5d;
              pUVar9 = UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
              iVar15 = 2;
              pBVar7 = (BMPSet *)0x5d;
              uVar11 = (undefined7)((ulong)pUVar9 >> 8);
              local_130 = CONCAT71(uVar11,2);
              local_108 = (BMPSet *)CONCAT71(uVar11,1);
            }
            result = (UChar *)(ulong)local_148;
            uVar8 = (ulong)local_144;
            if (symbols == (SymbolTable *)0x0 && (bVar17 || bVar16)) goto LAB_002bedbe;
          }
        }
        else {
          uVar1 = (ushort)(local_144 >> 0x10);
          if (iVar15 != 0x26) {
            if (iVar15 != 0x2d) goto LAB_002bedbe;
            if ((short)local_14c == 0) {
              if ((char)local_144 != '\0') {
                local_14c = (uint)CONCAT62((uint6)uVar1,0x2d);
                goto LAB_002bf461;
              }
              add(local_140,0x2d,0x2d);
              result = (UChar *)(ulong)local_134;
              UVar6 = RuleCharacterIterator::next
                                (chars,local_134,&local_14d,(UErrorCode *)in_stack_00000018);
              if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
              goto LAB_002bf5d9;
              if ((UVar6 == 0x5d) && (local_14d == '\0')) {
                result = L"-]";
                pUVar9 = UnicodeString::doAppend((UnicodeString *)local_e8,L"-]",0,2);
                local_80 = L"-]";
                goto LAB_002bf01f;
              }
            }
            goto LAB_002bf5cb;
          }
          if ((char)local_144 != '\x02' || (short)local_14c != 0) goto LAB_002bf5cb;
          local_14c = (uint)CONCAT62((uint6)uVar1,0x26);
LAB_002bf461:
          iVar15 = 2;
        }
      }
      else {
        result = (UChar *)(ulong)local_148;
        uVar8 = (ulong)local_144;
LAB_002bedbe:
        iVar15 = 0;
        uVar4 = (uint)pBVar7;
        if ((char)uVar8 == '\x02') {
          if ((short)local_14c != 0) goto LAB_002bf5cb;
LAB_002bf0ab:
          local_144 = (uint)CONCAT71((int7)(uVar8 >> 8),1);
          local_148 = uVar4;
        }
        else {
          uVar8 = uVar8 & 0xff;
          if ((int)uVar8 == 1) {
            UVar6 = (UChar32)result;
            if ((short)local_14c == 0x2d) {
              if ((int)uVar4 <= UVar6) goto LAB_002bf5cb;
              add(local_140,UVar6,uVar4);
              _appendToPat((UnicodeString *)local_e8,local_148,'\0');
              local_128._0_2_ = (short)local_14c;
              UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_128,0,1);
              iVar15 = 0;
              _appendToPat((UnicodeString *)local_e8,uVar4,'\0');
              local_144 = 0;
              goto LAB_002bf228;
            }
            add(local_140,UVar6,UVar6);
            result = (UChar *)(ulong)local_148;
            _appendToPat((UnicodeString *)local_e8,local_148,'\0');
            iVar15 = 0;
            local_148 = uVar4;
          }
          else if ((int)uVar8 == 0) goto LAB_002bf0ab;
        }
      }
    }
    else {
      if ((char)local_144 == '\x01') {
        if ((short)local_14c != 0) goto LAB_002bf5cb;
        add(local_140,local_148,local_148);
        local_144 = 0;
        result = (UChar *)(ulong)local_148;
        _appendToPat((UnicodeString *)local_e8,local_148,'\0');
        local_14c = 0;
      }
      uVar4 = local_14c & 0xffff;
      if (((short)local_14c == 0x2d) || (uVar4 == 0x26)) {
        local_128._0_2_ = (short)local_14c;
        result = (UChar *)local_128;
        UnicodeString::doAppend((UnicodeString *)local_e8,result,0,1);
      }
      if (this_00 == (BMPSet *)0x0) {
        if (local_110 == (BMPSet *)0x0) {
          pBVar7 = (BMPSet *)UMemory::operator_new((UMemory *)0x58,(size_t)result);
          if (pBVar7 == (BMPSet *)0x0) {
            local_110 = (BMPSet *)0x0;
          }
          else {
            UnicodeSet((UnicodeSet *)pBVar7);
            local_110 = pBVar7;
          }
        }
        this_00 = local_110;
        if (local_110 == (BMPSet *)0x0) {
          *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = 7;
          goto LAB_002bf5d9;
        }
      }
      if (cVar13 == '\x03') {
        result = (UChar *)local_e8;
        pUVar9 = _toPattern((UnicodeSet *)this_00,(UnicodeString *)result,'\0');
      }
      else if (cVar13 == '\x02') {
        RuleCharacterIterator::skipIgnored(chars,local_134);
        result = (UChar *)chars;
        applyPropertyPattern
                  ((UnicodeSet *)this_00,chars,(UnicodeString *)local_e8,
                   (UErrorCode *)in_stack_00000018);
        pUVar9 = in_stack_00000018;
        iVar15 = 1;
        if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
        goto LAB_002bf5df;
      }
      else {
        local_128._0_8_ = local_f8._vptr_UObject;
        local_128._8_8_ = local_100;
        result = (UChar *)chars;
        applyPattern((UnicodeSet *)this_00,chars,symbols,(UnicodeString *)local_e8,local_114,
                     (ulong)local_ec,(int32_t)local_f8._vptr_UObject,(UErrorCode *)local_100);
        pUVar9 = extraout_RAX;
      }
      if ((char)local_130 == '\0') {
        pUVar10 = operator=(local_140,(UnicodeSet *)this_00);
        uVar11 = (undefined7)((ulong)pUVar10 >> 8);
        local_130 = CONCAT71(uVar11,2);
        local_108 = (BMPSet *)CONCAT71(uVar11,1);
        result = (UChar *)this_00;
        iVar15 = 3;
      }
      else {
        iVar15 = 2;
        uVar11 = (undefined7)((ulong)pUVar9 >> 8);
        local_108 = (BMPSet *)CONCAT71(uVar11,1);
        if ((short)local_14c == 0) {
          local_144 = (uint)CONCAT71(uVar11,2);
          addAll(local_140,(UnicodeSet *)this_00);
          pBVar7 = this_00;
        }
        else if (uVar4 == 0x26) {
          local_144 = (uint)CONCAT71(uVar11,2);
          retainAll(local_140,(UnicodeSet *)this_00);
          pBVar7 = this_00;
        }
        else {
          local_144 = (uint)CONCAT71(uVar11,2);
          pBVar7 = (BMPSet *)result;
          if (uVar4 == 0x2d) {
            removeAll(local_140,(UnicodeSet *)this_00);
            pBVar7 = this_00;
          }
        }
LAB_002bf228:
        local_14c = 0;
        result = (UChar *)pBVar7;
      }
    }
LAB_002bf5df:
    if ((iVar15 != 0) && (iVar15 != 2)) {
      if (iVar15 != 3) goto LAB_002bf720;
      break;
    }
  } while ((char)local_130 != '\x02');
  uVar5 = 0x10002;
  if ((char)local_130 == '\x02') {
    RuleCharacterIterator::skipIgnored(chars,local_134);
    result = (UChar *)local_88;
    UVar12 = local_f8;
    if ((local_114 & 2) == 0) {
      if ((local_114 & 4) != 0) {
        if (((ulong)local_f8._vptr_UObject & 1) != 0) {
          UVar12._vptr_UObject =
               *(_func_int ***)
                (*(long *)((long)local_100 + (long)local_140) + -1 + (long)local_f8._vptr_UObject);
        }
        uVar14 = 4;
        goto LAB_002bf6a0;
      }
    }
    else {
      if (((ulong)local_f8._vptr_UObject & 1) != 0) {
        UVar12._vptr_UObject =
             *(_func_int ***)
              (*(long *)((long)local_100 + (long)local_140) + -1 + (long)local_f8._vptr_UObject);
      }
      uVar14 = 2;
LAB_002bf6a0:
      (*(code *)UVar12._vptr_UObject)((long)local_100 + (long)local_140,uVar14);
    }
    if (local_a8[0x10] != '\0') {
      complement(local_140);
    }
    if ((char)local_108 == '\0') {
      _generatePattern(local_140,(UnicodeString *)result,'\0');
    }
    else {
      if (-1 < (short)local_e8._8_2_) {
        local_e8._12_4_ = (int)(short)local_e8._8_2_ >> 5;
      }
      pBVar7 = (BMPSet *)local_e8;
      UnicodeString::doAppend((UnicodeString *)result,(UnicodeString *)pBVar7,0,local_e8._12_4_);
      result = (UChar *)pBVar7;
    }
    if (((local_140->fFlags & 1) == 0) ||
       (uVar5 = 7, 0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject))
    goto LAB_002bf720;
  }
  *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = uVar5;
LAB_002bf720:
  pBVar7 = local_110;
  if (local_110 != (BMPSet *)0x0) {
    ~UnicodeSet((UnicodeSet *)local_110);
    UMemory::operator_delete((UMemory *)pBVar7,result);
  }
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString((UnicodeString *)local_e8);
  return;
}

Assistant:

void UnicodeSet::applyPattern(RuleCharacterIterator& chars,
                              const SymbolTable* symbols,
                              UnicodeString& rebuiltPat,
                              uint32_t options,
                              UnicodeSet& (UnicodeSet::*caseClosure)(int32_t attribute),
                              int32_t depth,
                              UErrorCode& ec) {
    if (U_FAILURE(ec)) return;
    if (depth > MAX_DEPTH) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // Syntax characters: [ ] ^ - & { }

    // Recognized special forms for chars, sets: c-c s-s s&s

    int32_t opts = RuleCharacterIterator::PARSE_VARIABLES |
                   RuleCharacterIterator::PARSE_ESCAPES;
    if ((options & USET_IGNORE_SPACE) != 0) {
        opts |= RuleCharacterIterator::SKIP_WHITESPACE;
    }

    UnicodeString patLocal, buf;
    UBool usePat = FALSE;
    UnicodeSetPointer scratch;
    RuleCharacterIterator::Pos backup;

    // mode: 0=before [, 1=between [...], 2=after ]
    // lastItem: 0=none, 1=char, 2=set
    int8_t lastItem = 0, mode = 0;
    UChar32 lastChar = 0;
    UChar op = 0;

    UBool invert = FALSE;

    clear();

    while (mode != 2 && !chars.atEnd()) {
        U_ASSERT((lastItem == 0 && op == 0) ||
                 (lastItem == 1 && (op == 0 || op == HYPHEN /*'-'*/)) ||
                 (lastItem == 2 && (op == 0 || op == HYPHEN /*'-'*/ ||
                                    op == INTERSECTION /*'&'*/)));

        UChar32 c = 0;
        UBool literal = FALSE;
        UnicodeSet* nested = 0; // alias - do not delete

        // -------- Check for property pattern

        // setMode: 0=none, 1=unicodeset, 2=propertypat, 3=preparsed
        int8_t setMode = 0;
        if (resemblesPropertyPattern(chars, opts)) {
            setMode = 2;
        }

        // -------- Parse '[' of opening delimiter OR nested set.
        // If there is a nested set, use `setMode' to define how
        // the set should be parsed.  If the '[' is part of the
        // opening delimiter for this pattern, parse special
        // strings "[", "[^", "[-", and "[^-".  Check for stand-in
        // characters representing a nested set in the symbol
        // table.

        else {
            // Prepare to backup if necessary
            chars.getPos(backup);
            c = chars.next(opts, literal, ec);
            if (U_FAILURE(ec)) return;

            if (c == 0x5B /*'['*/ && !literal) {
                if (mode == 1) {
                    chars.setPos(backup); // backup
                    setMode = 1;
                } else {
                    // Handle opening '[' delimiter
                    mode = 1;
                    patLocal.append((UChar) 0x5B /*'['*/);
                    chars.getPos(backup); // prepare to backup
                    c = chars.next(opts, literal, ec); 
                    if (U_FAILURE(ec)) return;
                    if (c == 0x5E /*'^'*/ && !literal) {
                        invert = TRUE;
                        patLocal.append((UChar) 0x5E /*'^'*/);
                        chars.getPos(backup); // prepare to backup
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                    }
                    // Fall through to handle special leading '-';
                    // otherwise restart loop for nested [], \p{}, etc.
                    if (c == HYPHEN /*'-'*/) {
                        literal = TRUE;
                        // Fall through to handle literal '-' below
                    } else {
                        chars.setPos(backup); // backup
                        continue;
                    }
                }
            } else if (symbols != 0) {
                const UnicodeFunctor *m = symbols->lookupMatcher(c);
                if (m != 0) {
                    const UnicodeSet *ms = dynamic_cast<const UnicodeSet *>(m);
                    if (ms == NULL) {
                        ec = U_MALFORMED_SET;
                        return;
                    }
                    // casting away const, but `nested' won't be modified
                    // (important not to modify stored set)
                    nested = const_cast<UnicodeSet*>(ms);
                    setMode = 3;
                }
            }
        }

        // -------- Handle a nested set.  This either is inline in
        // the pattern or represented by a stand-in that has
        // previously been parsed and was looked up in the symbol
        // table.

        if (setMode != 0) {
            if (lastItem == 1) {
                if (op != 0) {
                    // syntaxError(chars, "Char expected after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastItem = 0;
                op = 0;
            }

            if (op == HYPHEN /*'-'*/ || op == INTERSECTION /*'&'*/) {
                patLocal.append(op);
            }

            if (nested == 0) {
                // lazy allocation
                if (!scratch.allocate()) {
                    ec = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                nested = scratch.pointer();
            }
            switch (setMode) {
            case 1:
                nested->applyPattern(chars, symbols, patLocal, options, caseClosure, depth + 1, ec);
                break;
            case 2:
                chars.skipIgnored(opts);
                nested->applyPropertyPattern(chars, patLocal, ec);
                if (U_FAILURE(ec)) return;
                break;
            case 3: // `nested' already parsed
                nested->_toPattern(patLocal, FALSE);
                break;
            }

            usePat = TRUE;

            if (mode == 0) {
                // Entire pattern is a category; leave parse loop
                *this = *nested;
                mode = 2;
                break;
            }

            switch (op) {
            case HYPHEN: /*'-'*/
                removeAll(*nested);
                break;
            case INTERSECTION: /*'&'*/
                retainAll(*nested);
                break;
            case 0:
                addAll(*nested);
                break;
            }

            op = 0;
            lastItem = 2;

            continue;
        }

        if (mode == 0) {
            // syntaxError(chars, "Missing '['");
            ec = U_MALFORMED_SET;
            return;
        }

        // -------- Parse special (syntax) characters.  If the
        // current character is not special, or if it is escaped,
        // then fall through and handle it below.

        if (!literal) {
            switch (c) {
            case 0x5D /*']'*/:
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                // Treat final trailing '-' as a literal
                if (op == HYPHEN /*'-'*/) {
                    add(op, op);
                    patLocal.append(op);
                } else if (op == INTERSECTION /*'&'*/) {
                    // syntaxError(chars, "Trailing '&'");
                    ec = U_MALFORMED_SET;
                    return;
                }
                patLocal.append((UChar) 0x5D /*']'*/);
                mode = 2;
                continue;
            case HYPHEN /*'-'*/:
                if (op == 0) {
                    if (lastItem != 0) {
                        op = (UChar) c;
                        continue;
                    } else {
                        // Treat final trailing '-' as a literal
                        add(c, c);
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x5D /*']'*/ && !literal) {
                            patLocal.append(HYPHEN_RIGHT_BRACE, 2);
                            mode = 2;
                            continue;
                        }
                    }
                }
                // syntaxError(chars, "'-' not after char or set");
                ec = U_MALFORMED_SET;
                return;
            case INTERSECTION /*'&'*/:
                if (lastItem == 2 && op == 0) {
                    op = (UChar) c;
                    continue;
                }
                // syntaxError(chars, "'&' not after set");
                ec = U_MALFORMED_SET;
                return;
            case 0x5E /*'^'*/:
                // syntaxError(chars, "'^' not after '['");
                ec = U_MALFORMED_SET;
                return;
            case 0x7B /*'{'*/:
                if (op != 0) {
                    // syntaxError(chars, "Missing operand after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                lastItem = 0;
                buf.truncate(0);
                {
                    UBool ok = FALSE;
                    while (!chars.atEnd()) {
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x7D /*'}'*/ && !literal) {
                            ok = TRUE;
                            break;
                        }
                        buf.append(c);
                    }
                    if (buf.length() < 1 || !ok) {
                        // syntaxError(chars, "Invalid multicharacter string");
                        ec = U_MALFORMED_SET;
                        return;
                    }
                }
                // We have new string. Add it to set and continue;
                // we don't need to drop through to the further
                // processing
                add(buf);
                patLocal.append((UChar) 0x7B /*'{'*/);
                _appendToPat(patLocal, buf, FALSE);
                patLocal.append((UChar) 0x7D /*'}'*/);
                continue;
            case SymbolTable::SYMBOL_REF:
                //         symbols  nosymbols
                // [a-$]   error    error (ambiguous)
                // [a$]    anchor   anchor
                // [a-$x]  var "x"* literal '$'
                // [a-$.]  error    literal '$'
                // *We won't get here in the case of var "x"
                {
                    chars.getPos(backup);
                    c = chars.next(opts, literal, ec);
                    if (U_FAILURE(ec)) return;
                    UBool anchor = (c == 0x5D /*']'*/ && !literal);
                    if (symbols == 0 && !anchor) {
                        c = SymbolTable::SYMBOL_REF;
                        chars.setPos(backup);
                        break; // literal '$'
                    }
                    if (anchor && op == 0) {
                        if (lastItem == 1) {
                            add(lastChar, lastChar);
                            _appendToPat(patLocal, lastChar, FALSE);
                        }
                        add(U_ETHER);
                        usePat = TRUE;
                        patLocal.append((UChar) SymbolTable::SYMBOL_REF);
                        patLocal.append((UChar) 0x5D /*']'*/);
                        mode = 2;
                        continue;
                    }
                    // syntaxError(chars, "Unquoted '$'");
                    ec = U_MALFORMED_SET;
                    return;
                }
            default:
                break;
            }
        }

        // -------- Parse literal characters.  This includes both
        // escaped chars ("\u4E01") and non-syntax characters
        // ("a").

        switch (lastItem) {
        case 0:
            lastItem = 1;
            lastChar = c;
            break;
        case 1:
            if (op == HYPHEN /*'-'*/) {
                if (lastChar >= c) {
                    // Don't allow redundant (a-a) or empty (b-a) ranges;
                    // these are most likely typos.
                    // syntaxError(chars, "Invalid range");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, c);
                _appendToPat(patLocal, lastChar, FALSE);
                patLocal.append(op);
                _appendToPat(patLocal, c, FALSE);
                lastItem = 0;
                op = 0;
            } else {
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastChar = c;
            }
            break;
        case 2:
            if (op != 0) {
                // syntaxError(chars, "Set expected after operator");
                ec = U_MALFORMED_SET;
                return;
            }
            lastChar = c;
            lastItem = 1;
            break;
        }
    }

    if (mode != 2) {
        // syntaxError(chars, "Missing ']'");
        ec = U_MALFORMED_SET;
        return;
    }

    chars.skipIgnored(opts);

    /**
     * Handle global flags (invert, case insensitivity).  If this
     * pattern should be compiled case-insensitive, then we need
     * to close over case BEFORE COMPLEMENTING.  This makes
     * patterns like /[^abc]/i work.
     */
    if ((options & USET_CASE_INSENSITIVE) != 0) {
        (this->*caseClosure)(USET_CASE_INSENSITIVE);
    }
    else if ((options & USET_ADD_CASE_MAPPINGS) != 0) {
        (this->*caseClosure)(USET_ADD_CASE_MAPPINGS);
    }
    if (invert) {
        complement();
    }

    // Use the rebuilt pattern (patLocal) only if necessary.  Prefer the
    // generated pattern.
    if (usePat) {
        rebuiltPat.append(patLocal);
    } else {
        _generatePattern(rebuiltPat, FALSE);
    }
    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
}